

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_debugprint.c
# Opt level: O1

void PaUtil_DebugPrint(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char strdump [2048];
  undefined1 auStack_8d8 [8];
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char local_808 [8];
  undefined1 *local_800;
  undefined1 *local_7f8;
  undefined1 local_9;
  
  local_818 = auStack_8d8;
  local_7f8 = auStack_8d8;
  if (in_AL != '\0') {
    local_8a8 = in_XMM0_Qa;
    local_898 = in_XMM1_Qa;
    local_888 = in_XMM2_Qa;
    local_878 = in_XMM3_Qa;
    local_868 = in_XMM4_Qa;
    local_858 = in_XMM5_Qa;
    local_848 = in_XMM6_Qa;
    local_838 = in_XMM7_Qa;
  }
  local_8d0 = in_RSI;
  local_8c8 = in_RDX;
  local_8c0 = in_RCX;
  local_8b8 = in_R8;
  local_8b0 = in_R9;
  if (userCB == (PaUtilLogCallback)0x0) {
    local_800 = &stack0x00000008;
    local_808[0] = '\b';
    local_808[1] = '\0';
    local_808[2] = '\0';
    local_808[3] = '\0';
    local_808[4] = '0';
    local_808[5] = '\0';
    local_808[6] = '\0';
    local_808[7] = '\0';
    vfprintf(_stderr,format,local_808);
    fflush(_stderr);
  }
  else {
    local_820 = &stack0x00000008;
    local_828 = 0x3000000008;
    vsnprintf(local_808,0x800,format,&local_828);
    local_9 = 0;
    (*userCB)(local_808);
  }
  return;
}

Assistant:

void PaUtil_DebugPrint( const char *format, ... )
{
    // Optional logging into Output console of Visual Studio
#if defined(_MSC_VER) && defined(PA_ENABLE_MSVC_DEBUG_OUTPUT)
    {
        char buf[PA_LOG_BUF_SIZE];
        va_list ap;
        va_start(ap, format);
        VSNPRINTF(buf, sizeof(buf), format, ap);
        buf[sizeof(buf)-1] = 0;
        OutputDebugStringA(buf);
        va_end(ap);
    }
#endif

    // Output to User-Callback
    if (userCB != NULL)
    {
        char strdump[PA_LOG_BUF_SIZE];
        va_list ap;
        va_start(ap, format);
        VSNPRINTF(strdump, sizeof(strdump), format, ap);
        strdump[sizeof(strdump)-1] = 0;
        userCB(strdump);
        va_end(ap);
    }
    else
    // Standard output to stderr
    {
        va_list ap;
        va_start(ap, format);
        vfprintf(stderr, format, ap);
        va_end(ap);
        fflush(stderr);
    }
}